

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O1

void __thiscall cursespp::ListOverlay::~ListOverlay(ListOverlay *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
  _vptr_IOrderable = (_func_int **)&PTR__ListOverlay_001a8d78;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IDisplayable.
  _vptr_IDisplayable = (_func_int **)&DAT_001a9000;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMouseHandler.
  _vptr_IMouseHandler = (_func_int **)&PTR__ListOverlay_001a9030;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMessageTarget.
  _vptr_IMessageTarget = (_func_int **)&PTR__ListOverlay_001a9058;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IWindowGroup._vptr_IWindowGroup =
       (_func_int **)&PTR__ListOverlay_001a9080;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__ListOverlay_001a9128;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__ListOverlay_001a9150;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__ListOverlay_001a9178;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__ListOverlay_001a91a8;
  (this->super_OverlayBase).super_IOverlay._vptr_IOverlay = (_func_int **)&PTR__ListOverlay_001a91d8
  ;
  (this->super_has_slots<sigslot::multi_threaded_local>).super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__ListOverlay_001a9200;
  CustomListWindow::Reset
            ((this->listWindow).
             super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  p_Var2 = (this->keyInterceptorCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->keyInterceptorCallback,(_Any_data *)&this->keyInterceptorCallback,
              __destroy_functor);
  }
  p_Var2 = (this->dismissedCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->dismissedCallback,(_Any_data *)&this->dismissedCallback,
              __destroy_functor);
  }
  p_Var2 = (this->deleteKeyCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->deleteKeyCallback,(_Any_data *)&this->deleteKeyCallback,
              __destroy_functor);
  }
  p_Var2 = (this->itemSelectedCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->itemSelectedCallback,(_Any_data *)&this->itemSelectedCallback,
              __destroy_functor);
  }
  p_Var3 = (this->scrollbar).super___shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->listWindow).
           super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->adapter).super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pcVar4 = (this->title)._M_dataplus._M_p;
  paVar1 = &(this->title).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  sigslot::has_slots<sigslot::multi_threaded_local>::~has_slots
            (&this->super_has_slots<sigslot::multi_threaded_local>);
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
  _vptr_IOrderable = (_func_int **)&PTR__OverlayBase_001a7578;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IDisplayable.
  _vptr_IDisplayable = (_func_int **)&PTR__OverlayBase_001a7800;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMouseHandler.
  _vptr_IMouseHandler = (_func_int **)&PTR__OverlayBase_001a7830;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMessageTarget.
  _vptr_IMessageTarget = (_func_int **)&PTR__OverlayBase_001a7858;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IWindowGroup._vptr_IWindowGroup =
       (_func_int **)&PTR__OverlayBase_001a7880;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__OverlayBase_001a7928;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__OverlayBase_001a7950;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__OverlayBase_001a7978;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__OverlayBase_001a79a8;
  (this->super_OverlayBase).super_IOverlay._vptr_IOverlay = (_func_int **)&PTR__OverlayBase_001a79d8
  ;
  (this->super_OverlayBase).stack = (OverlayStack *)0x0;
  LayoutBase::~LayoutBase((LayoutBase *)this);
  return;
}

Assistant:

ListOverlay::~ListOverlay() {
    this->listWindow->Reset();
}